

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this,char *name,bool quiet)

{
  std::ios::ios((ios *)&(this->super_ofstream).field_0x140);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x5d5cb0;
  *(undefined8 *)&(this->super_ofstream).field_0x140 = 0x5d5cd8;
  std::ofstream::ofstream
            (this,(char *)&PTR_construction_vtable_24__005d5cf0,
             (_Ios_Openmode)*(undefined8 *)&(this->super_ofstream).field_0x118);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x5d5cb0;
  *(undefined8 *)&(this->super_ofstream).field_0x140 = 0x5d5cd8;
  if (((this->super_ofstream).field_0x160 & 5) != 0 && !quiet) {
    cmSystemTools::Error
              ("Cannot open file for write: ",*(char **)&(this->super_ofstream).field_0x118,
               (char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(const char* name, bool quiet):
  cmGeneratedFileStreamBase(name),
  Stream(TempName.c_str())
{
  // Check if the file opened.
  if(!*this && !quiet)
    {
    cmSystemTools::Error("Cannot open file for write: ",
                         this->TempName.c_str());
    cmSystemTools::ReportLastSystemError("");
    }
}